

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution::generateList
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *cosines,
          vector<double,_std::allocator<double>_> *probabilities)

{
  ulong uVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double *pdVar4;
  iterator iVar5;
  uint args_1;
  ulong uVar6;
  long lVar7;
  
  uVar1 = (long)(cosines->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(cosines->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = uVar1 >> 3;
  args_1 = (uint)uVar6;
  if (uVar1 == (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (args_1 != 0) {
      lVar7 = 0;
      do {
        pdVar4 = (double *)
                 ((long)(cosines->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (iVar5._M_current == pdVar2) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar5,pdVar4);
          iVar5._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar5._M_current = *pdVar4;
          iVar5._M_current = iVar5._M_current + 1;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current;
        }
        pdVar4 = (double *)
                 ((long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                        .super__Vector_impl_data._M_start + lVar7);
        if (iVar5._M_current == pdVar2) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar5,pdVar4);
        }
        else {
          *iVar5._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        lVar7 = lVar7 + 8;
      } while ((uVar6 & 0xffffffff) << 3 != lVar7);
    }
    return __return_storage_ptr__;
  }
  tools::Log::info<char_const*>("The number of cosine and probability values must be the same");
  tools::Log::info<char_const*,unsigned_int>("cosines.size(): {}",args_1);
  tools::Log::info<char_const*,unsigned_long>
            ("probabilities.size(): {}",
             (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< double >
generateList( std::vector< double >&& cosines,
              std::vector< double >&& probabilities ) {

  unsigned int NL = cosines.size();
  if ( cosines.size() != probabilities.size() ) {

    Log::info( "The number of cosine and probability values must be the same" );
    Log::info( "cosines.size(): {}", NL );
    Log::info( "probabilities.size(): {}", probabilities.size() );
    throw std::exception();
  }

  std::vector< double > list;
  for ( unsigned int i = 0; i < NL; ++i ) {

    list.push_back( cosines[i] );
    list.push_back( probabilities[i] );
  }
  return list;
}